

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decallib.cpp
# Opt level: O2

void __thiscall FDecalLib::ParseDecalGroup(FDecalLib *this,FScanner *sc)

{
  char *name;
  bool bVar1;
  WORD WVar2;
  FDecalBase *decal;
  FDecalBase *value;
  FDecalLib *this_00;
  FString groupName;
  
  groupName.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  FScanner::MustGetString(sc);
  this_00 = (FDecalLib *)&groupName;
  FString::operator=((FString *)this_00,sc->String);
  WVar2 = GetDecalID(this_00,sc);
  FScanner::MustGetStringName(sc,"{");
  decal = (FDecalBase *)operator_new(0x40);
  (decal->Users).Array = (PClass **)0x0;
  (decal->Users).Most = 0;
  (decal->Users).Count = 0;
  (decal->Name).Index = 0;
  decal->_vptr_FDecalBase = (_func_int **)&PTR_GetDecal_007c6fe8;
  decal[1]._vptr_FDecalBase = (_func_int **)0x0;
  decal[1].Left = (FDecalBase *)&pr_decalchoice;
  while( true ) {
    FScanner::MustGetString(sc);
    bVar1 = FScanner::Compare(sc,"}");
    if (bVar1) break;
    name = sc->String;
    value = ScanTreeForName(name,this->Root);
    if (value == (FDecalBase *)0x0) {
      FScanner::ScriptError(sc,"%s has not been defined",name);
    }
    FScanner::MustGetNumber(sc);
    TWeightedList<FDecalBase_*>::AddEntry
              ((TWeightedList<FDecalBase_*> *)(decal + 1),value,(WORD)sc->Number);
  }
  FName::operator=(&decal->Name,&groupName);
  decal->SpawnID = WVar2;
  AddDecal(this,decal);
  FString::~FString(&groupName);
  return;
}

Assistant:

void FDecalLib::ParseDecalGroup (FScanner &sc)
{
	FString groupName;
	WORD decalNum;
	FDecalBase *targetDecal;
	FDecalGroup *group;

	sc.MustGetString ();
	groupName = sc.String;
	decalNum = GetDecalID (sc);
	sc.MustGetStringName ("{");

	group = new FDecalGroup;

	for (;;)
	{
		sc.MustGetString ();
		if (sc.Compare ("}"))
		{
			group->Name = groupName;
			group->SpawnID = decalNum;
			AddDecal (group);
			break;
		}

		targetDecal = ScanTreeForName (sc.String, Root);
		if (targetDecal == NULL)
		{
			sc.ScriptError ("%s has not been defined", sc.String);
		}
		sc.MustGetNumber ();

		group->AddDecal (targetDecal, sc.Number);
	}
}